

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O3

StringTree * capnp::compiler::expressionStringTree(Reader exp)

{
  byte bVar1;
  Reader exp_00;
  Reader exp_01;
  Reader exp_02;
  Reader params;
  Reader params_00;
  Branch *pBVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  StringTree *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  unsigned_long uVar7;
  CappedArray<char,_32UL> *params_01;
  ArrayPtr<const_char> *params_02;
  size_t sVar8;
  CappedArray<char,_26UL> *params_03;
  undefined8 unaff_RBX;
  ElementCount index;
  undefined8 unaff_RBP;
  size_t sVar9;
  StringTree *in_RDI;
  char (*params_2) [3];
  char *pcVar10;
  FixedArray<char,_1UL> *in_R9;
  undefined8 unaff_R12;
  ulong capacity;
  undefined8 unaff_R13;
  size_t sVar11;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Reader RVar17;
  StringPtr SVar18;
  Reader RVar19;
  undefined8 unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  CappedArray<char,_26UL> *in_stack_00000018;
  StringTree *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  undefined2 in_stack_0000002e;
  Vector<char> escaped;
  Reader list;
  Reader element;
  ArrayBuilder<kj::StringTree> parts;
  StringTree local_1d8;
  StringTree *local_198;
  undefined8 local_190;
  StringTree local_188;
  undefined8 local_150;
  undefined1 local_148 [56];
  StringTree *pSStack_110;
  StringTree *local_108;
  undefined8 *local_100;
  ListReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  ListReader local_60;
  
  params_02 = (ArrayPtr<const_char> *)(ulong)in_stack_00000028;
  if (in_stack_00000028 < 0x10) {
switchD_003aaeef_caseD_0:
    pSVar6 = &local_1d8;
    local_1d8.size_ = 0x57b49e;
    local_1d8.text.content.ptr = &DAT_0000000d;
LAB_003aaeae:
    pSVar6 = kj::StringTree::concat<kj::ArrayPtr<char_const>>(in_RDI,pSVar6,params_02);
  }
  else {
    local_198 = in_RDI;
    switch((short)in_stack_00000018->currentSize) {
    case 0:
      goto switchD_003aaeef_caseD_0;
    case 1:
      if (in_stack_00000028 < 0x80) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(unsigned_long *)in_stack_00000018->content;
      }
      kj::_::Stringifier::operator*
                ((CappedArray<char,_26UL> *)&local_1d8,(Stringifier *)&kj::_::STR,uVar7);
      pSVar6 = kj::StringTree::concat<kj::CappedArray<char,26ul>>(in_RDI,&local_1d8,params_03);
      break;
    case 2:
      if (in_stack_00000028 < 0x80) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(unsigned_long *)in_stack_00000018->content;
      }
      local_188.size_ = CONCAT71(local_188.size_._1_7_,0x2d);
      kj::_::Stringifier::operator*
                ((CappedArray<char,_26UL> *)&local_1d8,(Stringifier *)&kj::_::STR,uVar7);
      pSVar6 = kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
                         (in_RDI,&local_188,(FixedArray<char,_1UL> *)&local_1d8,in_stack_00000018);
      break;
    case 3:
      uVar13 = 0;
      uVar14 = 0;
      if (0x7f < in_stack_00000028) {
        uVar13 = (undefined4)*(undefined8 *)in_stack_00000018->content;
        uVar14 = (undefined4)((ulong)*(undefined8 *)in_stack_00000018->content >> 0x20);
      }
      kj::_::Stringifier::operator*
                ((CappedArray<char,_32UL> *)&local_1d8,(Stringifier *)&kj::_::STR,
                 (double)CONCAT44(uVar14,uVar13));
      pSVar6 = kj::StringTree::concat<kj::CappedArray<char,32ul>>(in_RDI,&local_1d8,params_01);
      break;
    case 4:
      bVar12 = in_stack_0000002c == 0;
      local_1d8.text.content.size_ = (size_t)in_stack_00000020;
      if (bVar12) {
        local_1d8.text.content.size_ = (size_t)(StringTree *)0x0;
      }
      iVar5 = 0x7fffffff;
      if (!bVar12) {
        iVar5 = (int)escaped.builder.ptr;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_1d8.size_ = CONCAT44(uVar14,uVar13);
      local_1d8.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_1d8.text.content.disposer =
           (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,iVar5);
      SVar18.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1d8,(void *)0x0,0);
      pSVar6 = stringLiteralStringTree(in_RDI,SVar18);
      break;
    case 5:
      bVar12 = in_stack_0000002c == 0;
      local_188.text.content.size_ = (size_t)in_stack_00000020;
      if (bVar12) {
        local_188.text.content.size_ = (size_t)(StringTree *)0x0;
      }
      if (bVar12) {
        escaped.builder.ptr._0_4_ = 0x7fffffff;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_188.size_ = CONCAT44(uVar14,uVar13);
      local_188.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_188.text.content.disposer._0_4_ = (int)escaped.builder.ptr;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_1d8,(PointerReader *)&local_188,(word *)0x0);
      local_188.text.content.size_ = (size_t)(StringTree *)0x0;
      local_188.text.content.disposer._0_4_ = 0x7fffffff;
      if (local_1d8.branches.ptr._4_2_ != 0) {
        local_188.text.content.size_ = (size_t)local_1d8.text.content.disposer;
        local_188.text.content.disposer._0_4_ = (uint)local_1d8.branches.size_;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (local_1d8.branches.ptr._4_2_ != 0) {
        uVar13 = (undefined4)local_1d8.size_;
        uVar14 = local_1d8.size_._4_4_;
        uVar15 = local_1d8.text.content.ptr._0_4_;
        uVar16 = local_1d8.text.content.ptr._4_4_;
      }
      local_188.size_ = CONCAT44(uVar14,uVar13);
      local_188.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      RVar17 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_188,(void *)0x0,0);
      local_188.size_ = RVar17.super_StringPtr.content.ptr;
      params_02 = (ArrayPtr<const_char> *)(RVar17.super_StringPtr.content.size_ - 1);
      pSVar6 = &local_188;
      local_188.text.content.ptr = (char *)params_02;
      goto LAB_003aaeae;
    case 6:
      bVar12 = in_stack_0000002c == 0;
      local_1d8.text.content.size_ = (size_t)in_stack_00000020;
      if (bVar12) {
        local_1d8.text.content.size_ = (size_t)(StringTree *)0x0;
      }
      iVar5 = 0x7fffffff;
      if (!bVar12) {
        iVar5 = (int)escaped.builder.ptr;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_1d8.size_ = CONCAT44(uVar14,uVar13);
      local_1d8.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_1d8.text.content.disposer =
           (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,iVar5);
      capnp::_::PointerReader::getList
                ((ListReader *)&local_188,(PointerReader *)&local_1d8,INLINE_COMPOSITE,(word *)0x0);
      capacity = (ulong)(uint)local_188.text.content.disposer;
      params_2 = (char (*) [3])0x0;
      pSVar6 = (StringTree *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_108 = pSVar6 + capacity;
      local_100 = &kj::_::HeapArrayDisposer::instance;
      local_190 = pSVar6;
      if ((uint)local_188.text.content.disposer != 0) {
        index = 0;
        local_148._48_8_ = pSVar6;
        do {
          pSStack_110 = pSVar6;
          capnp::_::ListReader::getStructElement
                    ((StructReader *)local_148,(ListReader *)&local_188,index);
          exp_00._reader.capTable._0_4_ = in_stack_00000008;
          exp_00._reader.segment = (SegmentReader *)unaff_retaddr;
          exp_00._reader.capTable._4_4_ = in_stack_0000000c;
          exp_00._reader.data._0_4_ = in_stack_00000010;
          exp_00._reader.data._4_4_ = in_stack_00000014;
          exp_00._reader.pointers = (WirePointer *)in_stack_00000018;
          exp_00._reader._32_8_ = in_stack_00000020;
          exp_00._reader.nestingLimit = in_stack_00000028;
          exp_00._reader._44_2_ = in_stack_0000002c;
          exp_00._reader._46_2_ = in_stack_0000002e;
          expressionStringTree(exp_00);
          pSVar6->size_ = local_1d8.size_;
          (pSVar6->text).content.ptr = local_1d8.text.content.ptr;
          (pSVar6->text).content.size_ = local_1d8.text.content.size_;
          local_1d8.text.content.ptr = (char *)0x0;
          local_1d8.text.content.size_ = 0;
          (pSVar6->text).content.disposer = local_1d8.text.content.disposer;
          (pSVar6->branches).ptr = local_1d8.branches.ptr;
          (pSVar6->branches).size_ = local_1d8.branches.size_;
          (pSVar6->branches).disposer = local_1d8.branches.disposer;
          pSVar6 = pSVar6 + 1;
          index = index + 1;
        } while ((uint)local_188.text.content.disposer != index);
      }
      local_148._8_8_ = ((long)pSVar6 - (long)local_190 >> 3) * 0x6db6db6db6db6db7;
      local_148._0_8_ = local_190;
      local_148._16_8_ = &kj::_::HeapArrayDisposer::instance;
      local_148._48_8_ = (ArrayDisposer *)0x0;
      pSStack_110 = (StringTree *)0x0;
      local_108 = (StringTree *)0x0;
      SVar18.content.size_ = 3;
      SVar18.content.ptr = ", ";
      kj::StringTree::StringTree(&local_1d8,(Array<kj::StringTree> *)local_148,SVar18);
      pSVar6 = kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
                         (local_198,(kj *)"[ ",(char (*) [3])&local_1d8,(StringTree *)0x52b27c,
                          params_2);
      sVar8 = local_1d8.branches.size_;
      pBVar2 = local_1d8.branches.ptr;
      if (local_1d8.branches.ptr != (Branch *)0x0) {
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.branches.size_ = 0;
        iVar5 = (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_01,iVar5);
      }
      sVar8 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      if (local_1d8.text.content.ptr != (char *)0x0) {
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        iVar5 = (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.text.content.disposer,pcVar10,1,sVar8,sVar8,0);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_02,iVar5);
      }
      uVar4 = local_148._8_8_;
      uVar3 = local_148._0_8_;
      if ((StringTree *)local_148._0_8_ != (StringTree *)0x0) {
        local_148._0_8_ = (StringTree *)0x0;
        local_148._8_8_ = (CapTableReader *)0x0;
        pSVar6 = (StringTree *)
                 (**(code **)*(WirePointer *)local_148._16_8_)
                           (local_148._16_8_,uVar3,0x38,uVar4,uVar4,
                            kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      break;
    case 7:
      bVar12 = in_stack_0000002c == 0;
      local_1d8.text.content.size_ = (size_t)in_stack_00000020;
      if (bVar12) {
        local_1d8.text.content.size_ = (size_t)(StringTree *)0x0;
      }
      iVar5 = 0x7fffffff;
      if (!bVar12) {
        iVar5 = (int)escaped.builder.ptr;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_1d8.size_ = CONCAT44(uVar14,uVar13);
      local_1d8.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_1d8.text.content.disposer =
           (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,iVar5);
      capnp::_::PointerReader::getList
                (&local_60,(PointerReader *)&local_1d8,INLINE_COMPOSITE,(word *)0x0);
      params.reader.capTable = (CapTableReader *)unaff_R12;
      params.reader.segment = (SegmentReader *)unaff_RBX;
      params.reader.ptr = (byte *)unaff_R13;
      params.reader.elementCount = (int)unaff_R14;
      params.reader.step = (int)((ulong)unaff_R14 >> 0x20);
      params.reader.structDataSize = (int)unaff_R15;
      params.reader.structPointerCount = (short)((ulong)unaff_R15 >> 0x20);
      params.reader.elementSize = (char)((ulong)unaff_R15 >> 0x30);
      params.reader._39_1_ = (char)((ulong)unaff_R15 >> 0x38);
      params.reader._40_8_ = unaff_RBP;
      pSVar6 = tupleLiteral(params);
      break;
    case 8:
      bVar12 = in_stack_0000002c == 0;
      local_1d8.text.content.size_ = (size_t)in_stack_00000020;
      if (bVar12) {
        local_1d8.text.content.size_ = (size_t)(StringTree *)0x0;
      }
      iVar5 = 0x7fffffff;
      if (!bVar12) {
        iVar5 = (int)escaped.builder.ptr;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_1d8.size_ = CONCAT44(uVar14,uVar13);
      local_1d8.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_1d8.text.content.disposer =
           (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,iVar5);
      RVar19 = capnp::_::PointerReader::getBlob<capnp::Data>
                         ((PointerReader *)&local_1d8,(void *)0x0,0);
      sVar8 = RVar19.super_ArrayPtr<const_unsigned_char>.size_;
      pcVar10 = (char *)0x0;
      local_1d8.text.content.ptr =
           (char *)kj::_::HeapArrayDisposer::allocateImpl
                             (1,0,sVar8 * 3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_1d8.text.content.size_ = (size_t)(local_1d8.text.content.ptr + sVar8 * 3);
      local_1d8.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_1d8.size_ = (size_t)local_1d8.text.content.ptr;
      if (sVar8 != 0) {
        sVar11 = 0;
        do {
          bVar1 = RVar19.super_ArrayPtr<const_unsigned_char>.ptr[sVar11];
          if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
            sVar9 = ((long)local_1d8.text.content.ptr - local_1d8.size_) * 2;
            if (local_1d8.text.content.ptr == (char *)local_1d8.size_) {
              sVar9 = 4;
            }
            kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar9);
          }
          *local_1d8.text.content.ptr = "0123456789abcdef"[bVar1 & 0xf];
          local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
          if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
            sVar9 = ((long)local_1d8.text.content.ptr - local_1d8.size_) * 2;
            if (local_1d8.text.content.ptr == (char *)local_1d8.size_) {
              sVar9 = 4;
            }
            kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar9);
          }
          *local_1d8.text.content.ptr = "0123456789abcdef"[bVar1 >> 4];
          local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
          if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
            sVar9 = ((long)local_1d8.text.content.ptr - local_1d8.size_) * 2;
            if (local_1d8.text.content.ptr == (char *)local_1d8.size_) {
              sVar9 = 4;
            }
            kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar9);
          }
          *local_1d8.text.content.ptr = ' ';
          local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
          sVar11 = sVar11 + 1;
        } while (sVar8 != sVar11);
      }
      local_1d8.text.content.ptr = local_1d8.text.content.ptr + -1;
      local_188.size_ = CONCAT71(local_188.size_._1_7_,0x22);
      pSVar6 = kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
                         (local_198,(kj *)"0x\"",(char (*) [4])&local_1d8,(Vector<char> *)&local_188
                          ,pcVar10);
      sVar11 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      sVar8 = local_1d8.size_;
      if ((char *)local_1d8.size_ != (char *)0x0) {
        local_1d8.size_ = 0;
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        iVar5 = (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.text.content.disposer,sVar8,1,(long)pcVar10 - sVar8,
                           sVar11 - sVar8,0);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_03,iVar5);
      }
      break;
    case 9:
      local_190 = (StringTree *)CONCAT44(in_stack_0000000c,in_stack_00000008);
      local_150 = (CapTableReader *)CONCAT44(in_stack_00000014,in_stack_00000010);
      local_188.text.content.ptr = (char *)local_150;
      local_188.text.content.size_ = (size_t)in_stack_00000020;
      local_188.size_ = (size_t)local_190;
      local_188.text.content.disposer._0_4_ = (int)escaped.builder.ptr;
      if (in_stack_0000002c == 0) {
        local_188.text.content.ptr = (char *)(CapTableReader *)0x0;
        local_188.text.content.size_ = (size_t)(StringTree *)0x0;
        local_188.size_ = (size_t)(StringTree *)0x0;
        local_188.text.content.disposer._0_4_ = 0x7fffffff;
      }
      capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_188,(word *)0x0);
      exp_01._reader.capTable._0_4_ = in_stack_00000008;
      exp_01._reader.segment = (SegmentReader *)unaff_retaddr;
      exp_01._reader.capTable._4_4_ = in_stack_0000000c;
      exp_01._reader.data._0_4_ = in_stack_00000010;
      exp_01._reader.data._4_4_ = in_stack_00000014;
      exp_01._reader.pointers = (WirePointer *)in_stack_00000018;
      exp_01._reader._32_8_ = in_stack_00000020;
      exp_01._reader.nestingLimit = in_stack_00000028;
      exp_01._reader._44_2_ = in_stack_0000002c;
      exp_01._reader._46_2_ = in_stack_0000002e;
      expressionStringTree(exp_01);
      local_148._16_8_ = (WirePointer *)0x0;
      local_148._0_8_ = (StringTree *)0x0;
      local_148._8_8_ = (CapTableReader *)0x0;
      local_148._24_4_ = 0x7fffffff;
      if (1 < in_stack_0000002c) {
        local_148._16_8_ = &in_stack_00000020->text;
        local_148._0_8_ = local_190;
        local_148._8_8_ = local_150;
        local_148._24_4_ = (int)escaped.builder.ptr;
      }
      capnp::_::PointerReader::getList
                (&local_f0,(PointerReader *)local_148,INLINE_COMPOSITE,(word *)0x0);
      params_00.reader.capTable = (CapTableReader *)unaff_R12;
      params_00.reader.segment = (SegmentReader *)unaff_RBX;
      params_00.reader.ptr = (byte *)unaff_R13;
      params_00.reader.elementCount = (int)unaff_R14;
      params_00.reader.step = (int)((ulong)unaff_R14 >> 0x20);
      params_00.reader.structDataSize = (int)unaff_R15;
      params_00.reader.structPointerCount = (short)((ulong)unaff_R15 >> 0x20);
      params_00.reader.elementSize = (char)((ulong)unaff_R15 >> 0x30);
      params_00.reader._39_1_ = (char)((ulong)unaff_R15 >> 0x38);
      params_00.reader._40_8_ = unaff_RBP;
      tupleLiteral(params_00);
      local_148[0] = 0x28;
      local_148[0x30] = 0x29;
      pSVar6 = kj::StringTree::
               concat<kj::StringTree,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                         (local_198,&local_1d8,(StringTree *)local_148,
                          (FixedArray<char,_1UL> *)&local_188,(StringTree *)(local_148 + 0x30),in_R9
                         );
      sVar8 = local_188.branches.size_;
      pBVar2 = local_188.branches.ptr;
      if (local_188.branches.ptr != (Branch *)0x0) {
        local_188.branches.ptr = (Branch *)0x0;
        local_188.branches.size_ = 0;
        iVar5 = (**(local_188.branches.disposer)->_vptr_ArrayDisposer)
                          (local_188.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,
                           local_f0.segment,local_f0.capTable,local_f0.ptr,local_f0._24_8_,
                           local_f0._32_8_,local_f0._40_8_);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_04,iVar5);
      }
      sVar8 = local_188.text.content.size_;
      pcVar10 = local_188.text.content.ptr;
      if ((CapTableReader *)local_188.text.content.ptr != (CapTableReader *)0x0) {
        local_188.text.content.ptr = (char *)0x0;
        local_188.text.content.size_ = 0;
        pSVar6 = (StringTree *)
                 (*(code *)**(undefined8 **)
                             CONCAT44(local_188.text.content.disposer._4_4_,
                                      (uint)local_188.text.content.disposer))
                           ((undefined8 *)
                            CONCAT44(local_188.text.content.disposer._4_4_,
                                     (uint)local_188.text.content.disposer),pcVar10,1,sVar8,sVar8,0)
        ;
      }
      sVar8 = local_1d8.branches.size_;
      pBVar2 = local_1d8.branches.ptr;
      if (local_1d8.branches.ptr != (Branch *)0x0) {
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.branches.size_ = 0;
        iVar5 = (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_05,iVar5);
      }
      sVar8 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      if (local_1d8.text.content.ptr != (char *)0x0) {
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        pSVar6 = (StringTree *)
                 (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                           (local_1d8.text.content.disposer,pcVar10,1,sVar8,sVar8,0);
      }
      break;
    case 10:
      local_190._0_4_ = in_stack_00000008;
      local_190._4_4_ = in_stack_0000000c;
      local_150._0_4_ = in_stack_00000010;
      local_150._4_4_ = in_stack_00000014;
      local_188.text.content.size_ = (size_t)in_stack_00000020;
      local_188.text.content.disposer._0_4_ = (int)escaped.builder.ptr;
      local_188.size_._0_4_ = in_stack_00000008;
      local_188.size_._4_4_ = in_stack_0000000c;
      local_188.text.content.ptr._0_4_ = in_stack_00000010;
      local_188.text.content.ptr._4_4_ = in_stack_00000014;
      if (in_stack_0000002c == 0) {
        local_188.text.content.ptr._0_4_ = 0;
        local_188.text.content.ptr._4_4_ = 0;
        local_188.size_._0_4_ = 0;
        local_188.size_._4_4_ = 0;
        local_188.text.content.size_ = (size_t)(StringTree *)0x0;
        local_188.text.content.disposer._0_4_ = 0x7fffffff;
      }
      capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)&local_188,(word *)0x0);
      exp_02._reader.capTable._0_4_ = in_stack_00000008;
      exp_02._reader.segment = (SegmentReader *)unaff_retaddr;
      exp_02._reader.capTable._4_4_ = in_stack_0000000c;
      exp_02._reader.data._0_4_ = in_stack_00000010;
      exp_02._reader.data._4_4_ = in_stack_00000014;
      exp_02._reader.pointers = (WirePointer *)in_stack_00000018;
      exp_02._reader._32_8_ = in_stack_00000020;
      exp_02._reader.nestingLimit = in_stack_00000028;
      exp_02._reader._44_2_ = in_stack_0000002c;
      exp_02._reader._46_2_ = in_stack_0000002e;
      expressionStringTree(exp_02);
      local_148._16_8_ = (WirePointer *)0x0;
      local_148._24_4_ = 0x7fffffff;
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (1 < in_stack_0000002c) {
        local_148._16_8_ = &in_stack_00000020->text;
        local_148._24_4_ = (int)escaped.builder.ptr;
        local_148._0_4_ = (undefined4)local_190;
        local_148._4_4_ = local_190._4_4_;
        local_148._8_4_ = (undefined4)local_150;
        local_148._12_4_ = local_150._4_4_;
      }
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_188,(PointerReader *)local_148,(word *)0x0);
      bVar12 = local_188.branches.ptr._4_2_ == 0;
      local_148._16_8_ =
           (WirePointer *)
           CONCAT44(local_188.text.content.disposer._4_4_,(uint)local_188.text.content.disposer);
      if (bVar12) {
        local_148._16_8_ = (WirePointer *)0x0;
      }
      local_148._24_4_ = 0x7fffffff;
      if (!bVar12) {
        local_148._24_4_ = (int)local_188.branches.size_;
      }
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (!bVar12) {
        local_148._0_4_ = (undefined4)local_188.size_;
        local_148._4_4_ = local_188.size_._4_4_;
        local_148._8_4_ = local_188.text.content.ptr._0_4_;
        local_148._12_4_ = local_188.text.content.ptr._4_4_;
      }
      RVar17 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_148,(void *)0x0,0);
      local_148._0_8_ = RVar17.super_StringPtr.content.ptr;
      local_148[0x30] = 0x2e;
      local_148._8_8_ = RVar17.super_StringPtr.content.size_ - 1;
      pSVar6 = kj::StringTree::
               concat<kj::StringTree,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                         (local_198,&local_1d8,(StringTree *)(local_148 + 0x30),
                          (FixedArray<char,_1UL> *)local_148,
                          (ArrayPtr<const_char> *)(local_148 + 0x30));
      sVar8 = local_1d8.branches.size_;
      pBVar2 = local_1d8.branches.ptr;
      if (local_1d8.branches.ptr != (Branch *)0x0) {
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.branches.size_ = 0;
        iVar5 = (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,
                           local_c0.segment,local_c0.capTable,local_c0.data,local_c0.pointers,
                           local_c0._32_8_,local_c0._40_8_);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_06,iVar5);
      }
      sVar8 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      if (local_1d8.text.content.ptr != (char *)0x0) {
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        pSVar6 = (StringTree *)
                 (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                           (local_1d8.text.content.disposer,pcVar10,1,sVar8,sVar8,0);
      }
      break;
    case 0xb:
      bVar12 = in_stack_0000002c == 0;
      if (bVar12) {
        in_stack_00000020 = (StringTree *)0x0;
      }
      if (bVar12) {
        escaped.builder.ptr._0_4_ = 0x7fffffff;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (!bVar12) {
        uVar13 = in_stack_00000008;
        uVar14 = in_stack_0000000c;
        uVar15 = in_stack_00000010;
        uVar16 = in_stack_00000014;
      }
      local_188.size_ = CONCAT44(uVar14,uVar13);
      local_188.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      local_188.text.content.size_ = (size_t)in_stack_00000020;
      local_188.text.content.disposer._0_4_ = (int)escaped.builder.ptr;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_1d8,(PointerReader *)&local_188,(word *)0x0);
      local_188.text.content.size_ = (size_t)(StringTree *)0x0;
      local_188.text.content.disposer._0_4_ = 0x7fffffff;
      if (local_1d8.branches.ptr._4_2_ != 0) {
        local_188.text.content.size_ = (size_t)local_1d8.text.content.disposer;
        local_188.text.content.disposer._0_4_ = (uint)local_1d8.branches.size_;
      }
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      if (local_1d8.branches.ptr._4_2_ != 0) {
        uVar13 = (undefined4)local_1d8.size_;
        uVar14 = local_1d8.size_._4_4_;
        uVar15 = local_1d8.text.content.ptr._0_4_;
        uVar16 = local_1d8.text.content.ptr._4_4_;
      }
      local_188.size_ = CONCAT44(uVar14,uVar13);
      local_188.text.content.ptr = (char *)CONCAT44(uVar16,uVar15);
      RVar17 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_188,(void *)0x0,0);
      local_188.size_ = RVar17.super_StringPtr.content.ptr;
      local_148[0] = 0x2e;
      local_188.text.content.ptr = (char *)(RVar17.super_StringPtr.content.size_ - 1);
      pSVar6 = kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                         (in_RDI,(StringTree *)local_148,(FixedArray<char,_1UL> *)&local_188,
                          (ArrayPtr<const_char> *)in_stack_00000020);
      break;
    case 0xc:
      bVar12 = in_stack_0000002c == 0;
      if (bVar12) {
        in_stack_00000020 = (StringTree *)0x0;
      }
      if (bVar12) {
        escaped.builder.ptr._0_4_ = 0x7fffffff;
      }
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (!bVar12) {
        local_148._0_4_ = in_stack_00000008;
        local_148._4_4_ = in_stack_0000000c;
        local_148._8_4_ = in_stack_00000010;
        local_148._12_4_ = in_stack_00000014;
      }
      local_148._16_8_ = in_stack_00000020;
      local_148._24_4_ = (int)escaped.builder.ptr;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_188,(PointerReader *)local_148,(word *)0x0);
      local_148._16_8_ = (WirePointer *)0x0;
      local_148._24_4_ = 0x7fffffff;
      if (local_188.branches.ptr._4_2_ != 0) {
        local_148._16_8_ =
             CONCAT44(local_188.text.content.disposer._4_4_,(uint)local_188.text.content.disposer);
        local_148._24_4_ = (int)local_188.branches.size_;
      }
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (local_188.branches.ptr._4_2_ != 0) {
        local_148._0_4_ = (undefined4)local_188.size_;
        local_148._4_4_ = local_188.size_._4_4_;
        local_148._8_4_ = local_188.text.content.ptr._0_4_;
        local_148._12_4_ = local_188.text.content.ptr._4_4_;
      }
      SVar18.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_148,(void *)0x0,0);
      stringLiteralStringTree(&local_1d8,SVar18);
      local_148._0_8_ = "import ";
      local_148._8_8_ = &DAT_00000007;
      pSVar6 = kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                         (in_RDI,(StringTree *)local_148,(ArrayPtr<const_char> *)&local_1d8,
                          in_stack_00000020);
      sVar8 = local_1d8.branches.size_;
      pBVar2 = local_1d8.branches.ptr;
      if (local_1d8.branches.ptr != (Branch *)0x0) {
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.branches.size_ = 0;
        iVar5 = (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        pSVar6 = (StringTree *)CONCAT44(extraout_var,iVar5);
      }
      sVar8 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      if (local_1d8.text.content.ptr != (char *)0x0) {
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        pSVar6 = (StringTree *)
                 (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                           (local_1d8.text.content.disposer,pcVar10,1,sVar8,sVar8,0);
      }
      break;
    case 0xd:
      bVar12 = in_stack_0000002c == 0;
      if (bVar12) {
        in_stack_00000020 = (StringTree *)0x0;
      }
      if (bVar12) {
        escaped.builder.ptr._0_4_ = 0x7fffffff;
      }
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (!bVar12) {
        local_148._0_4_ = in_stack_00000008;
        local_148._4_4_ = in_stack_0000000c;
        local_148._8_4_ = in_stack_00000010;
        local_148._12_4_ = in_stack_00000014;
      }
      local_148._16_8_ = in_stack_00000020;
      local_148._24_4_ = (int)escaped.builder.ptr;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_188,(PointerReader *)local_148,(word *)0x0);
      local_148._16_8_ = (WirePointer *)0x0;
      local_148._24_4_ = 0x7fffffff;
      if (local_188.branches.ptr._4_2_ != 0) {
        local_148._16_8_ =
             CONCAT44(local_188.text.content.disposer._4_4_,(uint)local_188.text.content.disposer);
        local_148._24_4_ = (int)local_188.branches.size_;
      }
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      if (local_188.branches.ptr._4_2_ != 0) {
        local_148._0_4_ = (undefined4)local_188.size_;
        local_148._4_4_ = local_188.size_._4_4_;
        local_148._8_4_ = local_188.text.content.ptr._0_4_;
        local_148._12_4_ = local_188.text.content.ptr._4_4_;
      }
      SVar18.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_148,(void *)0x0,0);
      stringLiteralStringTree(&local_1d8,SVar18);
      local_148._0_8_ = "embed ";
      local_148._8_8_ = (CapTableReader *)0x6;
      pSVar6 = kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                         (in_RDI,(StringTree *)local_148,(ArrayPtr<const_char> *)&local_1d8,
                          in_stack_00000020);
      sVar8 = local_1d8.branches.size_;
      pBVar2 = local_1d8.branches.ptr;
      if (local_1d8.branches.ptr != (Branch *)0x0) {
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.branches.size_ = 0;
        iVar5 = (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                          (local_1d8.branches.disposer,pBVar2,0x40,sVar8,sVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        pSVar6 = (StringTree *)CONCAT44(extraout_var_00,iVar5);
      }
      sVar8 = local_1d8.text.content.size_;
      pcVar10 = local_1d8.text.content.ptr;
      if (local_1d8.text.content.ptr != (char *)0x0) {
        local_1d8.text.content.ptr = (char *)0x0;
        local_1d8.text.content.size_ = 0;
        pSVar6 = (StringTree *)
                 (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                           (local_1d8.text.content.disposer,pcVar10,1,sVar8,sVar8,0);
      }
      break;
    default:
      kj::_::unreachable();
    }
  }
  return pSVar6;
}

Assistant:

static kj::StringTree expressionStringTree(Expression::Reader exp) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
      return kj::strTree("<parse error>");
    case Expression::POSITIVE_INT:
      return kj::strTree(exp.getPositiveInt());
    case Expression::NEGATIVE_INT:
      return kj::strTree('-', exp.getNegativeInt());
    case Expression::FLOAT:
      return kj::strTree(exp.getFloat());
    case Expression::STRING:
      return stringLiteralStringTree(exp.getString());
    case Expression::BINARY:
      return binaryLiteralStringTree(exp.getBinary());
    case Expression::RELATIVE_NAME:
      return kj::strTree(exp.getRelativeName().getValue());
    case Expression::ABSOLUTE_NAME:
      return kj::strTree('.', exp.getAbsoluteName().getValue());
    case Expression::IMPORT:
      return kj::strTree("import ", stringLiteralStringTree(exp.getImport().getValue()));
    case Expression::EMBED:
      return kj::strTree("embed ", stringLiteralStringTree(exp.getEmbed().getValue()));

    case Expression::LIST: {
      auto list = exp.getList();
      auto parts = kj::heapArrayBuilder<kj::StringTree>(list.size());
      for (auto element: list) {
        parts.add(expressionStringTree(element));
      }
      return kj::strTree("[ ", kj::StringTree(parts.finish(), ", "), " ]");
    }

    case Expression::TUPLE:
      return tupleLiteral(exp.getTuple());

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      return kj::strTree(expressionStringTree(app.getFunction()),
                         '(', tupleLiteral(app.getParams()), ')');
    }

    case Expression::MEMBER: {
      auto member = exp.getMember();
      return kj::strTree(expressionStringTree(member.getParent()), '.',
                         member.getName().getValue());
    }
  }

  KJ_UNREACHABLE;
}